

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm-parse.cc
# Opt level: O0

void __thiscall
ParserBuilder::ParserBuilder
          (ParserBuilder *this,ParameterCollection *model,
          unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
          *pretrained)

{
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  initializer_list<unsigned_int> x_08;
  initializer_list<unsigned_int> x_09;
  initializer_list<unsigned_int> x_10;
  initializer_list<unsigned_int> x_11;
  initializer_list<unsigned_int> x_12;
  initializer_list<unsigned_int> x_13;
  initializer_list<unsigned_int> x_14;
  initializer_list<unsigned_int> x_15;
  initializer_list<unsigned_int> x_16;
  initializer_list<unsigned_int> x_17;
  initializer_list<unsigned_int> x_18;
  initializer_list<unsigned_int> x_19;
  initializer_list<unsigned_int> x_20;
  initializer_list<unsigned_int> x_21;
  initializer_list<unsigned_int> x_22;
  initializer_list<unsigned_int> x_23;
  initializer_list<unsigned_int> x_24;
  initializer_list<unsigned_int> x_25;
  initializer_list<unsigned_int> x_26;
  uint uVar1;
  Dim *pDVar2;
  bool bVar3;
  undefined8 uVar4;
  iterator puVar5;
  size_type sVar6;
  undefined8 in_RDX;
  Dim *in_RSI;
  VanillaLSTMBuilder *in_RDI;
  value_type it;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  *__range2;
  pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_> *in_stack_fffffffffffff0e8;
  pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_> *in_stack_fffffffffffff0f0;
  Dim *in_stack_fffffffffffff2d0;
  Dim *this_00;
  iterator in_stack_fffffffffffff2d8;
  size_type in_stack_fffffffffffff2e0;
  allocator *paVar7;
  undefined8 local_b30;
  undefined8 local_b28;
  allocator local_b19;
  string local_b18 [32];
  uint local_af8;
  uint local_af4;
  uint *local_af0;
  undefined8 local_ae8;
  string local_adc [36];
  undefined8 local_ab8;
  uint local_ab0;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_false>
  local_a90;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_false>
  local_a88;
  undefined8 local_a80;
  allocator local_a71;
  string local_a70 [36];
  uint local_a4c;
  uint *local_a48;
  undefined8 local_a40;
  string local_a34 [36];
  undefined8 local_a10;
  allocator local_a01;
  string local_a00 [32];
  uint local_9e0;
  uint local_9dc;
  uint *local_9d8;
  undefined8 local_9d0;
  string local_9c4 [36];
  undefined8 local_9a0;
  allocator local_991;
  string local_990 [36];
  uint local_96c;
  uint *local_968;
  undefined8 local_960;
  string local_954 [36];
  undefined8 local_930;
  allocator local_921;
  string local_920 [32];
  uint local_900;
  int local_8fc;
  uint *local_8f8;
  undefined8 local_8f0;
  string local_8e8 [39];
  allocator local_8c1;
  string local_8c0 [36];
  uint local_89c;
  uint *local_898;
  undefined8 local_890;
  string local_888 [39];
  allocator local_861;
  string local_860 [36];
  uint local_83c;
  uint *local_838;
  undefined8 local_830;
  string local_828 [39];
  allocator local_801;
  string local_800 [36];
  uint local_7dc;
  uint *local_7d8;
  undefined8 local_7d0;
  string local_7c8 [39];
  allocator local_7a1;
  string local_7a0 [36];
  uint local_77c;
  uint *local_778;
  undefined8 local_770;
  string local_768 [39];
  allocator local_741;
  string local_740 [36];
  uint local_71c;
  uint *local_718;
  undefined8 local_710;
  string local_708 [39];
  allocator local_6e1;
  string local_6e0 [36];
  uint local_6bc;
  uint *local_6b8;
  undefined8 local_6b0;
  string local_6a8 [39];
  allocator local_681;
  string local_680 [36];
  uint local_65c;
  uint *local_658;
  undefined8 local_650;
  string local_648 [39];
  allocator local_621;
  string local_620 [36];
  uint local_5fc;
  uint *local_5f8;
  undefined8 local_5f0;
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [32];
  uint local_5a0;
  uint local_59c;
  uint *local_598;
  undefined8 local_590;
  string local_588 [39];
  allocator local_561;
  string local_560 [36];
  uint local_53c;
  uint *local_538;
  undefined8 local_530;
  string local_528 [39];
  allocator local_501;
  string local_500 [36];
  uint local_4dc;
  uint *local_4d8;
  undefined8 local_4d0;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [32];
  uint local_480;
  uint local_47c;
  uint *local_478;
  undefined8 local_470;
  string local_468 [39];
  allocator local_441;
  string local_440 [32];
  uint local_420;
  uint local_41c;
  uint *local_418;
  undefined8 local_410;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [32];
  uint local_3c0;
  uint local_3bc;
  uint *local_3b8;
  undefined8 local_3b0;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [32];
  uint local_360;
  uint local_35c;
  uint *local_358;
  undefined8 local_350;
  string local_348 [39];
  allocator local_321;
  string local_320 [32];
  uint local_300;
  uint local_2fc;
  uint *local_2f8;
  undefined8 local_2f0;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  uint local_2a0;
  uint local_29c;
  uint *local_298;
  undefined8 local_290;
  string local_288 [39];
  allocator local_261;
  string local_260 [32];
  uint local_240;
  uint local_23c;
  uint *local_238;
  undefined8 local_230;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  uint local_1e0;
  uint local_1dc;
  uint *local_1d8;
  undefined8 local_1d0;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [36];
  uint local_17c;
  uint *local_178;
  undefined8 local_170;
  string local_168 [39];
  allocator local_141;
  string local_140 [36];
  uint local_11c;
  uint *local_118;
  undefined8 local_110;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [36];
  uint local_bc;
  uint *local_b8;
  undefined8 local_b0;
  string local_a8 [39];
  allocator local_81;
  string local_80 [36];
  uint local_5c;
  uint *local_58;
  undefined8 local_50;
  string local_48 [48];
  undefined8 local_18;
  Dim *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (in_RDI,LAYERS,LSTM_INPUT_DIM,HIDDEN_DIM,(ParameterCollection *)in_RSI,false);
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (in_RDI + 0x1d0,LAYERS,LSTM_INPUT_DIM,HIDDEN_DIM,(ParameterCollection *)local_10,false);
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (in_RDI + 0x3a0,LAYERS,LSTM_INPUT_DIM,HIDDEN_DIM,(ParameterCollection *)local_10,false);
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (in_RDI + 0x570,LAYERS,ACTION_DIM,HIDDEN_DIM,(ParameterCollection *)local_10,false);
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (in_RDI + 0x740,LAYERS,LSTM_INPUT_DIM,LSTM_INPUT_DIM,(ParameterCollection *)local_10,
             false);
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (in_RDI + 0x910,LAYERS,LSTM_INPUT_DIM,LSTM_INPUT_DIM,(ParameterCollection *)local_10,
             false);
  pDVar2 = local_10;
  uVar1 = VOCAB_SIZE;
  local_5c = INPUT_DIM;
  local_58 = &local_5c;
  local_50 = 1;
  x._M_len = in_stack_fffffffffffff2e0;
  x._M_array = in_stack_fffffffffffff2d8;
  dynet::Dim::Dim(in_stack_fffffffffffff2d0,x);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",&local_81);
  uVar4 = dynet::ParameterCollection::add_lookup_parameters
                    ((uint)pDVar2,(Dim *)(ulong)uVar1,local_48,(Device *)local_80);
  *(undefined8 *)(in_RDI + 0xae0) = uVar4;
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  dynet::LookupParameter::LookupParameter((LookupParameter *)(in_RDI + 0xae8));
  pDVar2 = local_10;
  uVar1 = ACTION_SIZE;
  local_bc = ACTION_DIM;
  local_b8 = &local_bc;
  local_b0 = 1;
  x_00._M_len = in_stack_fffffffffffff2e0;
  x_00._M_array = in_stack_fffffffffffff2d8;
  dynet::Dim::Dim(in_stack_fffffffffffff2d0,x_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"",&local_e1);
  uVar4 = dynet::ParameterCollection::add_lookup_parameters
                    ((uint)pDVar2,(Dim *)(ulong)uVar1,local_a8,(Device *)local_e0);
  *(undefined8 *)(in_RDI + 0xaf0) = uVar4;
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  pDVar2 = local_10;
  uVar1 = ACTION_SIZE;
  local_11c = REL_DIM;
  local_118 = &local_11c;
  local_110 = 1;
  x_01._M_len = in_stack_fffffffffffff2e0;
  x_01._M_array = in_stack_fffffffffffff2d8;
  dynet::Dim::Dim(in_stack_fffffffffffff2d0,x_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"",&local_141);
  uVar4 = dynet::ParameterCollection::add_lookup_parameters
                    ((uint)pDVar2,(Dim *)(ulong)uVar1,local_108,(Device *)local_140);
  *(undefined8 *)(in_RDI + 0xaf8) = uVar4;
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  dynet::LookupParameter::LookupParameter((LookupParameter *)(in_RDI + 0xb00));
  pDVar2 = local_10;
  local_17c = HIDDEN_DIM;
  local_178 = &local_17c;
  local_170 = 1;
  x_02._M_len = in_stack_fffffffffffff2e0;
  x_02._M_array = in_stack_fffffffffffff2d8;
  dynet::Dim::Dim(in_stack_fffffffffffff2d0,x_02);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"",&local_1a1);
  uVar4 = dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_168,(Device *)local_1a0);
  *(undefined8 *)(in_RDI + 0xb08) = uVar4;
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  pDVar2 = local_10;
  local_1e0 = HIDDEN_DIM;
  local_1dc = HIDDEN_DIM;
  local_1d8 = &local_1e0;
  local_1d0 = 2;
  x_03._M_len = in_stack_fffffffffffff2e0;
  x_03._M_array = in_stack_fffffffffffff2d8;
  dynet::Dim::Dim(in_stack_fffffffffffff2d0,x_03);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"",&local_201);
  uVar4 = dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_1c8,(Device *)local_200);
  *(undefined8 *)(in_RDI + 0xb10) = uVar4;
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  pDVar2 = local_10;
  local_240 = HIDDEN_DIM;
  local_23c = HIDDEN_DIM;
  local_238 = &local_240;
  local_230 = 2;
  x_04._M_len = in_stack_fffffffffffff2e0;
  x_04._M_array = in_stack_fffffffffffff2d8;
  dynet::Dim::Dim(in_stack_fffffffffffff2d0,x_04);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"",&local_261);
  uVar4 = dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_228,(Device *)local_260);
  *(undefined8 *)(in_RDI + 0xb18) = uVar4;
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  pDVar2 = local_10;
  local_2a0 = HIDDEN_DIM;
  local_29c = HIDDEN_DIM;
  local_298 = &local_2a0;
  local_290 = 2;
  x_05._M_len = in_stack_fffffffffffff2e0;
  x_05._M_array = in_stack_fffffffffffff2d8;
  dynet::Dim::Dim(in_stack_fffffffffffff2d0,x_05);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"",&local_2c1);
  uVar4 = dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_288,(Device *)local_2c0);
  *(undefined8 *)(in_RDI + 0xb20) = uVar4;
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  pDVar2 = local_10;
  local_300 = HIDDEN_DIM;
  local_2fc = HIDDEN_DIM;
  local_2f8 = &local_300;
  local_2f0 = 2;
  x_06._M_len = in_stack_fffffffffffff2e0;
  x_06._M_array = in_stack_fffffffffffff2d8;
  dynet::Dim::Dim(in_stack_fffffffffffff2d0,x_06);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"",&local_321);
  uVar4 = dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_2e8,(Device *)local_320);
  *(undefined8 *)(in_RDI + 0xb28) = uVar4;
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  pDVar2 = local_10;
  local_360 = LSTM_INPUT_DIM;
  local_35c = LSTM_INPUT_DIM;
  local_358 = &local_360;
  local_350 = 2;
  x_07._M_len = in_stack_fffffffffffff2e0;
  x_07._M_array = in_stack_fffffffffffff2d8;
  dynet::Dim::Dim(in_stack_fffffffffffff2d0,x_07);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,"",&local_381);
  uVar4 = dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_348,(Device *)local_380);
  *(undefined8 *)(in_RDI + 0xb30) = uVar4;
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  pDVar2 = local_10;
  local_3c0 = LSTM_INPUT_DIM;
  local_3bc = LSTM_INPUT_DIM;
  local_3b8 = &local_3c0;
  local_3b0 = 2;
  x_08._M_len = in_stack_fffffffffffff2e0;
  x_08._M_array = in_stack_fffffffffffff2d8;
  dynet::Dim::Dim(in_stack_fffffffffffff2d0,x_08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"",&local_3e1);
  uVar4 = dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_3a8,(Device *)local_3e0);
  *(undefined8 *)(in_RDI + 0xb38) = uVar4;
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  pDVar2 = local_10;
  local_420 = LSTM_INPUT_DIM;
  local_41c = REL_DIM;
  local_418 = &local_420;
  local_410 = 2;
  x_09._M_len = in_stack_fffffffffffff2e0;
  x_09._M_array = in_stack_fffffffffffff2d8;
  dynet::Dim::Dim(in_stack_fffffffffffff2d0,x_09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_440,"",&local_441);
  uVar4 = dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_408,(Device *)local_440);
  *(undefined8 *)(in_RDI + 0xb40) = uVar4;
  std::__cxx11::string::~string(local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  pDVar2 = local_10;
  local_480 = LSTM_INPUT_DIM;
  local_47c = INPUT_DIM;
  local_478 = &local_480;
  local_470 = 2;
  x_10._M_len = in_stack_fffffffffffff2e0;
  x_10._M_array = in_stack_fffffffffffff2d8;
  dynet::Dim::Dim(in_stack_fffffffffffff2d0,x_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"",&local_4a1);
  uVar4 = dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_468,(Device *)local_4a0);
  *(undefined8 *)(in_RDI + 0xb48) = uVar4;
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  dynet::Parameter::Parameter((Parameter *)(in_RDI + 0xb50));
  dynet::Parameter::Parameter((Parameter *)(in_RDI + 0xb58));
  pDVar2 = local_10;
  local_4dc = LSTM_INPUT_DIM;
  local_4d8 = &local_4dc;
  local_4d0 = 1;
  x_11._M_len = in_stack_fffffffffffff2e0;
  x_11._M_array = in_stack_fffffffffffff2d8;
  dynet::Dim::Dim(in_stack_fffffffffffff2d0,x_11);
  paVar7 = &local_501;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_500,"",paVar7);
  puVar5 = (iterator)
           dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_4c8,(Device *)local_500);
  *(iterator *)(in_RDI + 0xb60) = puVar5;
  std::__cxx11::string::~string(local_500);
  std::allocator<char>::~allocator((allocator<char> *)&local_501);
  local_53c = LSTM_INPUT_DIM;
  local_538 = &local_53c;
  local_530 = 1;
  x_12._M_len = (size_type)paVar7;
  x_12._M_array = puVar5;
  this_00 = local_10;
  dynet::Dim::Dim(local_10,x_12);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_560,"",&local_561);
  uVar4 = dynet::ParameterCollection::add_parameters(this_00,0.0,local_528,(Device *)local_560);
  *(undefined8 *)(in_RDI + 0xb68) = uVar4;
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  pDVar2 = local_10;
  local_5a0 = ACTION_SIZE;
  local_59c = HIDDEN_DIM;
  local_598 = &local_5a0;
  local_590 = 2;
  x_13._M_len = (size_type)paVar7;
  x_13._M_array = puVar5;
  dynet::Dim::Dim(this_00,x_13);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c0,"",&local_5c1);
  uVar4 = dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_588,(Device *)local_5c0);
  *(undefined8 *)(in_RDI + 0xb70) = uVar4;
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  pDVar2 = local_10;
  local_5fc = ACTION_DIM;
  local_5f8 = &local_5fc;
  local_5f0 = 1;
  x_14._M_len = (size_type)paVar7;
  x_14._M_array = puVar5;
  dynet::Dim::Dim(this_00,x_14);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_620,"",&local_621);
  uVar4 = dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_5e8,(Device *)local_620);
  *(undefined8 *)(in_RDI + 0xb78) = uVar4;
  std::__cxx11::string::~string(local_620);
  std::allocator<char>::~allocator((allocator<char> *)&local_621);
  pDVar2 = local_10;
  local_65c = ACTION_SIZE;
  local_658 = &local_65c;
  local_650 = 1;
  x_15._M_len = (size_type)paVar7;
  x_15._M_array = puVar5;
  dynet::Dim::Dim(this_00,x_15);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_680,"",&local_681);
  uVar4 = dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_648,(Device *)local_680);
  *(undefined8 *)(in_RDI + 0xb80) = uVar4;
  std::__cxx11::string::~string(local_680);
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  pDVar2 = local_10;
  local_6bc = LSTM_INPUT_DIM;
  local_6b8 = &local_6bc;
  local_6b0 = 1;
  x_16._M_len = (size_type)paVar7;
  x_16._M_array = puVar5;
  dynet::Dim::Dim(this_00,x_16);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6e0,"",&local_6e1);
  uVar4 = dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_6a8,(Device *)local_6e0);
  *(undefined8 *)(in_RDI + 0xb88) = uVar4;
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
  pDVar2 = local_10;
  local_71c = LSTM_INPUT_DIM;
  local_718 = &local_71c;
  local_710 = 1;
  x_17._M_len = (size_type)paVar7;
  x_17._M_array = puVar5;
  dynet::Dim::Dim(this_00,x_17);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_740,"",&local_741);
  uVar4 = dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_708,(Device *)local_740);
  *(undefined8 *)(in_RDI + 0xb90) = uVar4;
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator((allocator<char> *)&local_741);
  pDVar2 = local_10;
  local_77c = LSTM_INPUT_DIM;
  local_778 = &local_77c;
  local_770 = 1;
  x_18._M_len = (size_type)paVar7;
  x_18._M_array = puVar5;
  dynet::Dim::Dim(this_00,x_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7a0,"",&local_7a1);
  uVar4 = dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_768,(Device *)local_7a0);
  *(undefined8 *)(in_RDI + 0xb98) = uVar4;
  std::__cxx11::string::~string(local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
  pDVar2 = local_10;
  local_7dc = LSTM_INPUT_DIM;
  local_7d8 = &local_7dc;
  local_7d0 = 1;
  x_19._M_len = (size_type)paVar7;
  x_19._M_array = puVar5;
  dynet::Dim::Dim(this_00,x_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_800,"",&local_801);
  uVar4 = dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_7c8,(Device *)local_800);
  *(undefined8 *)(in_RDI + 0xba0) = uVar4;
  std::__cxx11::string::~string(local_800);
  std::allocator<char>::~allocator((allocator<char> *)&local_801);
  pDVar2 = local_10;
  local_83c = LSTM_INPUT_DIM;
  local_838 = &local_83c;
  local_830 = 1;
  x_20._M_len = (size_type)paVar7;
  x_20._M_array = puVar5;
  dynet::Dim::Dim(this_00,x_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_860,"",&local_861);
  uVar4 = dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_828,(Device *)local_860);
  *(undefined8 *)(in_RDI + 0xba8) = uVar4;
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  pDVar2 = local_10;
  uVar1 = CHAR_SIZE;
  local_89c = INPUT_DIM;
  local_898 = &local_89c;
  local_890 = 1;
  x_21._M_len = (size_type)paVar7;
  x_21._M_array = puVar5;
  dynet::Dim::Dim(this_00,x_21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8c0,"",&local_8c1);
  uVar4 = dynet::ParameterCollection::add_lookup_parameters
                    ((uint)pDVar2,(Dim *)(ulong)uVar1,local_888,(Device *)local_8c0);
  *(undefined8 *)(in_RDI + 0xbb0) = uVar4;
  std::__cxx11::string::~string(local_8c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (in_RDI + 3000,LAYERS,LSTM_INPUT_DIM,LSTM_CHAR_OUTPUT_DIM >> 1,
             (ParameterCollection *)local_10,false);
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (in_RDI + 0xd88,LAYERS,LSTM_INPUT_DIM,LSTM_CHAR_OUTPUT_DIM >> 1,
             (ParameterCollection *)local_10,false);
  pDVar2 = local_10;
  local_900 = LSTM_INPUT_DIM;
  local_8fc = LSTM_INPUT_DIM * 2;
  local_8f8 = &local_900;
  local_8f0 = 2;
  x_22._M_len = (size_type)paVar7;
  x_22._M_array = puVar5;
  dynet::Dim::Dim(this_00,x_22);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_920,"",&local_921);
  uVar4 = dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_8e8,(Device *)local_920);
  *(undefined8 *)(in_RDI + 0xf58) = uVar4;
  std::__cxx11::string::~string(local_920);
  std::allocator<char>::~allocator((allocator<char> *)&local_921);
  pDVar2 = local_10;
  uVar1 = POS_SIZE;
  if ((USE_POS & 1U) != 0) {
    local_96c = POS_DIM;
    local_968 = &local_96c;
    local_960 = 1;
    x_23._M_len = (size_type)paVar7;
    x_23._M_array = puVar5;
    dynet::Dim::Dim(this_00,x_23);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_990,"",&local_991);
    local_930 = dynet::ParameterCollection::add_lookup_parameters
                          ((uint)pDVar2,(Dim *)(ulong)uVar1,local_954,(Device *)local_990);
    *(undefined8 *)(in_RDI + 0xb00) = local_930;
    std::__cxx11::string::~string(local_990);
    std::allocator<char>::~allocator((allocator<char> *)&local_991);
    pDVar2 = local_10;
    local_9e0 = LSTM_INPUT_DIM;
    local_9dc = POS_DIM;
    local_9d8 = &local_9e0;
    local_9d0 = 2;
    x_24._M_len = (size_type)paVar7;
    x_24._M_array = puVar5;
    dynet::Dim::Dim(this_00,x_24);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a00,"",&local_a01);
    local_9a0 = dynet::ParameterCollection::add_parameters(pDVar2,0.0,local_9c4,(Device *)local_a00)
    ;
    *(undefined8 *)(in_RDI + 0xb50) = local_9a0;
    std::__cxx11::string::~string(local_a00);
    std::allocator<char>::~allocator((allocator<char> *)&local_a01);
  }
  sVar6 = std::
          unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
          ::size((unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                  *)0x161051);
  pDVar2 = local_10;
  uVar1 = VOCAB_SIZE;
  if (sVar6 == 0) {
    dynet::LookupParameter::LookupParameter
              ((LookupParameter *)&local_b28,(LookupParameterStorage *)0x0);
    *(undefined8 *)(in_RDI + 0xae8) = local_b28;
    dynet::Parameter::Parameter((Parameter *)&local_b30,(ParameterStorage *)0x0);
    *(undefined8 *)(in_RDI + 0xb58) = local_b30;
  }
  else {
    local_a4c = PRETRAINED_DIM;
    local_a48 = &local_a4c;
    local_a40 = 1;
    x_25._M_len = (size_type)paVar7;
    x_25._M_array = puVar5;
    dynet::Dim::Dim(this_00,x_25);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a70,"",&local_a71);
    local_a10 = dynet::ParameterCollection::add_lookup_parameters
                          ((uint)pDVar2,(Dim *)(ulong)uVar1,local_a34,(Device *)local_a70);
    *(undefined8 *)(in_RDI + 0xae8) = local_a10;
    std::__cxx11::string::~string(local_a70);
    std::allocator<char>::~allocator((allocator<char> *)&local_a71);
    local_a80 = local_18;
    local_a88._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
         ::begin((unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                  *)in_stack_fffffffffffff0e8);
    local_a90._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
         ::end((unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                *)in_stack_fffffffffffff0e8);
    while( true ) {
      bVar3 = std::__detail::operator!=(&local_a88,&local_a90);
      if (!bVar3) break;
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_false,_false>
      ::operator*((_Node_const_iterator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_false,_false>
                   *)0x1611b9);
      std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>::pair
                (in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
      dynet::LookupParameter::initialize((int)in_RDI + 0xae8,(vector *)(ulong)local_ab0);
      std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>::~pair
                ((pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_> *)0x1611fd);
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_false,_false>
      ::operator++((_Node_const_iterator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_false,_false>
                    *)in_stack_fffffffffffff0f0);
    }
    local_af8 = LSTM_INPUT_DIM;
    local_af4 = PRETRAINED_DIM;
    local_af0 = &local_af8;
    local_ae8 = 2;
    x_26._M_len = (size_type)paVar7;
    x_26._M_array = puVar5;
    dynet::Dim::Dim(this_00,x_26);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b18,"",&local_b19);
    local_ab8 = dynet::ParameterCollection::add_parameters
                          (local_10,0.0,local_adc,(Device *)local_b18);
    *(undefined8 *)(in_RDI + 0xb58) = local_ab8;
    std::__cxx11::string::~string(local_b18);
    std::allocator<char>::~allocator((allocator<char> *)&local_b19);
  }
  return;
}

Assistant:

explicit ParserBuilder(ParameterCollection & model, const unordered_map<unsigned, vector<float>>& pretrained) :
      stack_lstm(LAYERS, LSTM_INPUT_DIM, HIDDEN_DIM, model),
      output_lstm(LAYERS, LSTM_INPUT_DIM, HIDDEN_DIM, model),
      buffer_lstm(LAYERS, LSTM_INPUT_DIM, HIDDEN_DIM, model),
      action_lstm(LAYERS, ACTION_DIM, HIDDEN_DIM, model),
      ent_lstm_fwd(LAYERS, LSTM_INPUT_DIM, LSTM_INPUT_DIM, model), 
      ent_lstm_rev(LAYERS, LSTM_INPUT_DIM, LSTM_INPUT_DIM, model),
      p_w(model.add_lookup_parameters(VOCAB_SIZE, {INPUT_DIM})),
      p_a(model.add_lookup_parameters(ACTION_SIZE, {ACTION_DIM})),
      p_r(model.add_lookup_parameters(ACTION_SIZE, {REL_DIM})),
      p_pbias(model.add_parameters({HIDDEN_DIM})),
      p_A(model.add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_B(model.add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_O(model.add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_S(model.add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_H(model.add_parameters({LSTM_INPUT_DIM, LSTM_INPUT_DIM})),
      p_D(model.add_parameters({LSTM_INPUT_DIM, LSTM_INPUT_DIM})),
      p_R(model.add_parameters({LSTM_INPUT_DIM, REL_DIM})),
      p_w2l(model.add_parameters({LSTM_INPUT_DIM, INPUT_DIM})),
      p_ib(model.add_parameters({LSTM_INPUT_DIM})),
      p_cbias(model.add_parameters({LSTM_INPUT_DIM})),
      p_p2a(model.add_parameters({ACTION_SIZE, HIDDEN_DIM})),
      p_action_start(model.add_parameters({ACTION_DIM})),
      p_abias(model.add_parameters({ACTION_SIZE})),

      p_buffer_guard(model.add_parameters({LSTM_INPUT_DIM})),
      p_stack_guard(model.add_parameters({LSTM_INPUT_DIM})),
      p_output_guard(model.add_parameters({LSTM_INPUT_DIM})),

      p_start_of_word(model.add_parameters({LSTM_INPUT_DIM})), //Miguel
      p_end_of_word(model.add_parameters({LSTM_INPUT_DIM})), //Miguel 

      char_emb(model.add_lookup_parameters(CHAR_SIZE, {INPUT_DIM})),//Miguel

//      fw_char_lstm(LAYERS, LSTM_CHAR_OUTPUT_DIM, LSTM_INPUT_DIM, model), //Miguel
//      bw_char_lstm(LAYERS, LSTM_CHAR_OUTPUT_DIM, LSTM_INPUT_DIM,  model), //Miguel

      fw_char_lstm(LAYERS, LSTM_INPUT_DIM, LSTM_CHAR_OUTPUT_DIM/2, model), //Miguel 
      bw_char_lstm(LAYERS, LSTM_INPUT_DIM, LSTM_CHAR_OUTPUT_DIM/2, model), /*Miguel*/
      p_cW(model.add_parameters({LSTM_INPUT_DIM, LSTM_INPUT_DIM * 2})) { //ner. {
    if (USE_POS) {
      p_p = model.add_lookup_parameters(POS_SIZE, {POS_DIM});
      p_p2l = model.add_parameters({LSTM_INPUT_DIM, POS_DIM});
    }
    if (pretrained.size() > 0) {
      p_t = model.add_lookup_parameters(VOCAB_SIZE, {PRETRAINED_DIM});
      for (auto it : pretrained)
        p_t.initialize(it.first, it.second);
      p_t2l = model.add_parameters({LSTM_INPUT_DIM, PRETRAINED_DIM});
    } else {
      p_t = nullptr;
      p_t2l = nullptr;
    }
  }